

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O1

bool __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicObject *object,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  Type *addr;
  Type TVar1;
  DynamicTypeHandler *pDVar2;
  long *plVar3;
  int *piVar4;
  code *pcVar5;
  type_info *ptVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint initialPropertyCount;
  BOOL BVar11;
  BigPropertyIndex initialPropertyCount_00;
  undefined4 *puVar12;
  CachedData *pCVar13;
  Recycler *this_00;
  DynamicType *dynamicType;
  WriteBarrierPtr<Js::PropertyString> *pWVar14;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->scriptContext).ptr = requestContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  addr = &this->object;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->object).ptr = object;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->flags = flags;
  if (object == (DynamicObject *)0x0) {
    (this->cachedData).ptr = (CachedData *)0x0;
    return true;
  }
  this->objectIndex = -1;
  this->enumeratedCount = 0;
  dynamicType = (DynamicType *)(object->super_RecyclableObject).type.ptr;
  if (((~flags & 0xc) != 0) ||
     (((this->scriptContext).ptr)->threadContext->TTDLog != (EventLog *)0x0)) {
    pDVar2 = (dynamicType->typeHandler).ptr;
    iVar10 = (*pDVar2->_vptr_DynamicTypeHandler[0x10])(pDVar2,object);
    if ((char)iVar10 == '\0') {
      return false;
    }
    dynamicType = (DynamicType *)(object->super_RecyclableObject).type.ptr;
    initialPropertyCount_00 = -1;
    if ((this->flags & SnapShotSemantics) != None) {
      initialPropertyCount_00 =
           (*(addr->ptr->super_RecyclableObject).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
    }
    pCVar13 = (CachedData *)0x0;
LAB_00dc1f83:
    Initialize(this,dynamicType,pCVar13,initialPropertyCount_00);
    return true;
  }
  if ((enumeratorCache != (EnumeratorCache *)0x0) &&
     (dynamicType == (DynamicType *)enumeratorCache->type)) {
    pCVar13 = (CachedData *)enumeratorCache->data;
    if (pCVar13 == (CachedData *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0x49,"(data != nullptr)","data != nullptr");
      if (!bVar8) goto LAB_00dc1f99;
      *puVar12 = 0;
    }
    if ((pCVar13->scriptContext).ptr != (this->scriptContext).ptr) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0x4a,"(data->scriptContext == this->scriptContext)",
                                  "data->scriptContext == this->scriptContext");
      if (!bVar8) goto LAB_00dc1f99;
      *puVar12 = 0;
    }
    if ((pCVar13->enumNonEnumerable == (Type)(this->flags & EnumNonEnumerable)) &&
       (pCVar13->enumSymbols == ((this->flags >> 1 & 1) != 0))) {
      initialPropertyCount_00 = pCVar13->propertyCount;
      goto LAB_00dc1f83;
    }
  }
  pCVar13 = (CachedData *)
            ThreadContext::GetDynamicObjectEnumeratorCache
                      (requestContext->threadContext,dynamicType);
  if ((((pCVar13 != (CachedData *)0x0) &&
       ((pCVar13->scriptContext).ptr == (this->scriptContext).ptr)) &&
      (pCVar13->enumNonEnumerable == (Type)(this->flags & EnumNonEnumerable))) &&
     (pCVar13->enumSymbols == ((this->flags >> 1 & 1) != 0))) {
    Initialize(this,dynamicType,pCVar13,pCVar13->propertyCount);
    if (enumeratorCache != (EnumeratorCache *)0x0) {
      enumeratorCache->type = (Type *)dynamicType;
      enumeratorCache->data = pCVar13;
      return true;
    }
    return true;
  }
  plVar3 = *(long **)((object->super_RecyclableObject).type.ptr + 1);
  cVar9 = (**(code **)(*plVar3 + 0x80))(plVar3,object);
  if (cVar9 == '\0') {
    return false;
  }
  dynamicType = (DynamicType *)(object->super_RecyclableObject).type.ptr;
  bVar8 = DynamicType::PrepareForTypeSnapshotEnumeration(dynamicType);
  if (!bVar8) {
    initialPropertyCount_00 =
         (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject[10])(object);
    pCVar13 = (CachedData *)0x0;
    goto LAB_00dc1f83;
  }
  initialPropertyCount = DynamicObject::GetPropertyCountForEnum(addr->ptr);
  data._32_8_ = ZEXT48(initialPropertyCount);
  ptVar6 = (type_info *)(data._32_8_ * 0xd);
  local_80 = (undefined1  [8])&CachedData::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ad8def;
  data.filename._0_4_ = 0x70;
  data.typeinfo = ptVar6;
  this_00 = Memory::Recycler::TrackAllocInfo(requestContext->recycler,(TrackAllocData *)local_80);
  BVar11 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar11 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar8) goto LAB_00dc1f99;
    *puVar12 = 0;
  }
  pCVar13 = (CachedData *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this_00,(size_t)(ptVar6 + 0x30));
  if (pCVar13 == (CachedData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar8) {
LAB_00dc1f99:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  (pCVar13->indexes).ptr = (int *)0x0;
  (pCVar13->attributes).ptr = (uchar *)0x0;
  (pCVar13->scriptContext).ptr = (ScriptContext *)0x0;
  (pCVar13->strings).ptr = (WriteBarrierPtr<Js::PropertyString> *)0x0;
  Memory::Recycler::WBSetBit((char *)pCVar13);
  (pCVar13->scriptContext).ptr = requestContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pCVar13);
  pCVar13->cachedCount = 0;
  pCVar13->propertyCount = initialPropertyCount;
  Memory::Recycler::WBSetBit((char *)&pCVar13->strings);
  (pCVar13->strings).ptr = (WriteBarrierPtr<Js::PropertyString> *)(pCVar13 + 1);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pCVar13->strings);
  uVar7 = data._32_8_;
  pWVar14 = (pCVar13->strings).ptr + data._32_8_;
  Memory::Recycler::WBSetBit((char *)&pCVar13->indexes);
  (pCVar13->indexes).ptr = (int *)pWVar14;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pCVar13->indexes);
  piVar4 = (pCVar13->indexes).ptr;
  Memory::Recycler::WBSetBit((char *)&pCVar13->attributes);
  (pCVar13->attributes).ptr = (uchar *)(piVar4 + uVar7);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pCVar13->attributes);
  pCVar13->completed = false;
  TVar1 = this->flags;
  pCVar13->enumNonEnumerable = (Type)(TVar1 & EnumNonEnumerable);
  pCVar13->enumSymbols = (Type)(TVar1 >> 1 & 1);
  ThreadContext::AddDynamicObjectEnumeratorCache(requestContext->threadContext,dynamicType,pCVar13);
  Initialize(this,dynamicType,pCVar13,initialPropertyCount);
  if (enumeratorCache != (EnumeratorCache *)0x0) {
    enumeratorCache->type = (Type *)dynamicType;
    enumeratorCache->data = pCVar13;
    return true;
  }
  return true;
}

Assistant:

bool DynamicObjectPropertyEnumerator::Initialize(DynamicObject * object, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->scriptContext = requestContext;
        this->object = object;
        this->flags = flags;

        if (!object)
        {
            this->cachedData = nullptr;
            return true;
        }

        this->objectIndex = Constants::NoBigSlot;
        this->enumeratedCount = 0;

        if (!GetUseCache())
        {
            if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
            {
                return false;
            }
            Initialize(object->GetDynamicType(), nullptr, GetSnapShotSemantics() ? this->object->GetPropertyCount() : Constants::NoBigSlot);
            return true;
        }

        DynamicType * type = object->GetDynamicType();

        CachedData * data;
        if (enumeratorCache && type == enumeratorCache->type)
        {
            data = (CachedData *)enumeratorCache->data;

            Assert(data != nullptr);
            Assert(data->scriptContext == this->scriptContext); // The cache data script context should be the same as request context

            if (data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
            {
                Initialize(type, data, data->propertyCount);
                return true;
            }
        }

        data = (CachedData *)requestContext->GetThreadContext()->GetDynamicObjectEnumeratorCache(type);

        if (data != nullptr && data->scriptContext == this->scriptContext && data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
        {
            Initialize(type, data, data->propertyCount);

            if (enumeratorCache)
            {
                enumeratorCache->type = type;
                enumeratorCache->data = data;
            }
            return true;
        }

        if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
        {
            return false;
        }

        // Reload the type after EnsureObjectReady
        type = object->GetDynamicType();
        if (!type->PrepareForTypeSnapshotEnumeration())
        {
            Initialize(type, nullptr, object->GetPropertyCount());
            return true;
        }

        uint propertyCount = this->object->GetPropertyCountForEnum();
        data = RecyclerNewStructPlus(requestContext->GetRecycler(),
            propertyCount * sizeof(Field(PropertyString*)) + propertyCount * sizeof(BigPropertyIndex) + propertyCount * sizeof(PropertyAttributes), CachedData);
        data->scriptContext = requestContext;
        data->cachedCount = 0;
        data->propertyCount = propertyCount;
        data->strings = reinterpret_cast<Field(PropertyString*)*>(data + 1);
        data->indexes = unsafe_write_barrier_cast<BigPropertyIndex *>(data->strings + propertyCount);
        data->attributes = (PropertyAttributes*)(data->indexes + propertyCount);
        data->completed = false;
        data->enumNonEnumerable = GetEnumNonEnumerable();
        data->enumSymbols = GetEnumSymbols();
        requestContext->GetThreadContext()->AddDynamicObjectEnumeratorCache(type, data);
        Initialize(type, data, propertyCount);

        if (enumeratorCache)
        {
            enumeratorCache->type = type;
            enumeratorCache->data = data;
        }
        return true;
    }